

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commodities.cpp
# Opt level: O1

uint32_t units::getCommodity(string *comm)

{
  char *pcVar1;
  pointer pcVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  iterator iVar6;
  const_iterator cVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  uint32_t code;
  string *__range1;
  char *pcVar11;
  char *pcVar12;
  char cVar13;
  long lVar14;
  size_type sVar15;
  uint32_t uVar16;
  size_type sVar17;
  string *comm_00;
  long *local_40 [2];
  long local_30 [2];
  
  uVar5 = std::__cxx11::string::find((char)comm,0x5c);
  if (uVar5 < comm->_M_string_length - 1) {
    do {
      bVar8 = (comm->_M_dataplus)._M_p[uVar5 + 1];
      uVar9 = bVar8 - 0x5b;
      if (((uVar9 < 0x23) && ((0x500000007U >> ((ulong)uVar9 & 0x3f) & 1) != 0)) ||
         (bVar8 - 0x28 < 2)) {
        std::__cxx11::string::erase((ulong)comm,uVar5);
      }
      uVar5 = std::__cxx11::string::find((char)comm,0x5c);
    } while (uVar5 < comm->_M_string_length - 1);
  }
  sVar17 = comm->_M_string_length;
  if (sVar17 != 0) {
    pcVar2 = (comm->_M_dataplus)._M_p;
    sVar15 = 0;
    do {
      iVar4 = tolower((int)pcVar2[sVar15]);
      pcVar2[sVar15] = (char)iVar4;
      sVar15 = sVar15 + 1;
    } while (sVar17 != sVar15);
  }
  if (((_ZN5unitsL22allowCustomCommoditiesE_0 & 1) != 0) &&
     (customCommodityCodes_abi_cxx11_._24_8_ != 0)) {
    iVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)customCommodityCodes_abi_cxx11_,comm);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
        ._M_cur != (__node_type *)0x0) {
      sVar17 = (size_type)
               *(uint *)((long)iVar6.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                               ._M_cur + 0x28);
    }
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
        ._M_cur != (__node_type *)0x0) {
      return (uint32_t)sVar17;
    }
  }
  cVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)commodities::commodity_codes_abi_cxx11_,comm);
  if (cVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
      ._M_cur != (__node_type *)0x0) {
    return *(uint32_t *)
            ((long)cVar7.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                   ._M_cur + 0x28);
  }
  iVar4 = std::__cxx11::string::compare((ulong)comm,0,(char *)0x7);
  if (iVar4 == 0) {
    uVar5 = strtoul((comm->_M_dataplus)._M_p + 7,(char **)0x0,0);
    return (uint32_t)uVar5;
  }
  uVar5 = comm->_M_string_length;
  if (5 < uVar5) goto LAB_00191203;
  pcVar3 = (comm->_M_dataplus)._M_p;
  pcVar1 = pcVar3 + uVar5;
  pcVar11 = pcVar3;
  if (3 < uVar5) {
    pcVar11 = pcVar3 + ((uint)uVar5 & 4);
    lVar14 = (uVar5 >> 2) + 1;
    pcVar12 = pcVar3 + 3;
    do {
      if (pcVar12[-3] != ' ' && (byte)(pcVar12[-3] + 0x82U) < 0xe1) {
        pcVar12 = pcVar12 + -3;
        goto LAB_001911fa;
      }
      if (pcVar12[-2] != ' ' && (byte)(pcVar12[-2] + 0x82U) < 0xe1) {
        pcVar12 = pcVar12 + -2;
        goto LAB_001911fa;
      }
      if (pcVar12[-1] != ' ' && (byte)(pcVar12[-1] + 0x82U) < 0xe1) {
        pcVar12 = pcVar12 + -1;
        goto LAB_001911fa;
      }
      if (*pcVar12 != ' ' && (byte)(*pcVar12 + 0x82U) < 0xe1) goto LAB_001911fa;
      lVar14 = lVar14 + -1;
      pcVar12 = pcVar12 + 4;
    } while (1 < lVar14);
  }
  lVar14 = (long)pcVar1 - (long)pcVar11;
  if (lVar14 == 1) {
LAB_001911e0:
    pcVar12 = pcVar11;
    if (0xe0 < (byte)(*pcVar11 + 0x82U)) {
      pcVar12 = pcVar1;
    }
    if (*pcVar11 == ' ') {
      pcVar12 = pcVar1;
    }
  }
  else if (lVar14 == 2) {
LAB_001911c1:
    pcVar12 = pcVar11;
    if (*pcVar11 == ' ' || 0xe0 < (byte)(*pcVar11 + 0x82U)) {
      pcVar11 = pcVar11 + 1;
      goto LAB_001911e0;
    }
  }
  else {
    pcVar12 = pcVar1;
    if ((lVar14 == 3) && (pcVar12 = pcVar11, *pcVar11 == ' ' || 0xe0 < (byte)(*pcVar11 + 0x82U))) {
      pcVar11 = pcVar11 + 1;
      goto LAB_001911c1;
    }
  }
LAB_001911fa:
  if (pcVar12 == pcVar1) {
    if (uVar5 != 0) {
      uVar16 = 0x40000000;
      uVar10 = 0;
      bVar8 = 0;
      do {
        cVar13 = pcVar3[uVar10] + -0x5f;
        if (pcVar3[uVar10] == ' ') {
          cVar13 = '\0';
        }
        uVar16 = uVar16 + ((int)cVar13 << (bVar8 & 0x1f));
        bVar8 = bVar8 + 5;
        uVar10 = uVar10 + 1;
      } while (uVar5 != uVar10);
      return uVar16;
    }
    return 0x40000000;
  }
LAB_00191203:
  pcVar2 = (comm->_M_dataplus)._M_p;
  if (uVar5 == 0) {
    comm_00 = (string *)0x60000025;
  }
  else {
    uVar9 = 0x25;
    uVar10 = 0;
    do {
      uVar9 = pcVar2[uVar10] * 0x12ca3 ^ uVar9 * 0xd32b;
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
    comm_00 = (string *)(ulong)(uVar9 & 0x1fffffff | 0x60000000);
  }
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>((string *)local_40,pcVar2,pcVar2 + uVar5);
  addCustomCommodity((units *)local_40,comm_00,code);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return (uint32_t)comm_00;
}

Assistant:

uint32_t getCommodity(std::string comm)
{
    removeEscapeSequences(comm);
    std::transform(comm.begin(), comm.end(), comm.begin(), ::tolower);
    if (allowCustomCommodities.load(std::memory_order_acquire)) {
        if (!customCommodityCodes.empty()) {
            auto fnd2 = customCommodityCodes.find(comm);
            if (fnd2 != customCommodityCodes.end()) {
                return fnd2->second;
            }
        }
    }

    auto fnd = commodities::commodity_codes.find(comm);
    if (fnd != commodities::commodity_codes.end()) {
        return fnd->second;
    }

    if (comm.compare(0, 7, "cxcomm[") == 0) {
        return strtoul(comm.c_str() + 7, nullptr, 0);
    }
    if ((comm.size() < 6) && std::all_of(comm.begin(), comm.end(), [](char x) {
            return (x == ' ' || (x >= '_' && x <= '}'));
        })) {
        std::uint32_t hkey{0x40000000};
        unsigned int shift{0};
        for (auto c : comm) {
            if (c == ' ') {
                c = '_';
            }
            c -= '_';
            hkey += static_cast<std::uint32_t>(c) << shift;
            shift += 5;
        }
        return hkey;
    }
    // generate a hash code for a custom string
    auto hcode = stringHash(comm);
    hcode &= 0x1FFFFFFFU;
    hcode |= 0x60000000U;
    addCustomCommodity(comm, hcode);

    return hcode;
}